

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kclient.cpp
# Opt level: O2

void __thiscall Kraken::KClient::KClient(KClient *this,string *key,string *secret)

{
  EVP_PKEY_CTX *ctx;
  allocator local_2a;
  allocator local_29;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  std::__cxx11::string::string((string *)&this->secret_,(string *)secret);
  std::__cxx11::string::string((string *)&this->url_,"https://api.kraken.com",&local_29);
  ctx = (EVP_PKEY_CTX *)0x11a6bf;
  std::__cxx11::string::string((string *)&this->version_,"0",&local_2a);
  init(this,ctx);
  return;
}

Assistant:

KClient::KClient(const std::string& key, const std::string& secret)
   :key_(key), secret_(secret), url_("https://api.kraken.com"), version_("0") 
{ 
   init(); 
}